

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_dstr.c
# Opt level: O0

arg_dstr_t arg_dstr_create(void)

{
  arg_dstr_t __s;
  _internal_arg_dstr_t *h;
  
  __s = (arg_dstr_t)argtable3_xmalloc(0xf0);
  memset(__s,0,0xf0);
  __s->sbuf[0] = '\0';
  __s->data = __s->sbuf;
  __s->free_proc = (arg_dstr_freefn *)0x0;
  return __s;
}

Assistant:

arg_dstr_t arg_dstr_create(void) {
    _internal_arg_dstr_t* h = (_internal_arg_dstr_t*)xmalloc(sizeof(_internal_arg_dstr_t));
    memset(h, 0, sizeof(_internal_arg_dstr_t));
    h->sbuf[0] = 0;
    h->data = h->sbuf;
    h->free_proc = ARG_DSTR_STATIC;
    return h;
}